

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.h
# Opt level: O2

void __thiscall Liby::udp_io_task::~udp_io_task(udp_io_task *this)

{
  std::unique_ptr<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>::
  ~unique_ptr(&this->handler_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->buffer_).super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

udp_io_task() = default;